

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void tok_read_defines(tokcxdef *ctx,osfildef *fp,errcxdef *ec)

{
  int iVar1;
  tokcxdef *ctx_00;
  size_t sVar2;
  tokdfdef *ptVar3;
  errcxdef *in_RDX;
  FILE *in_RSI;
  long in_RDI;
  char buf [4];
  tokdfdef *df;
  tokdfdef **dfp;
  int i;
  char *in_stack_ffffffffffffffb8;
  errcxdef *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  errcxdef *in_stack_ffffffffffffffd0;
  int local_1c;
  
  local_1c = 0x40;
  ctx_00 = (tokcxdef *)(in_RDI + 0x2b0);
  do {
    if (local_1c == 0) {
      return;
    }
    while( true ) {
      sVar2 = fread(&stack0xffffffffffffffcc,4,1,in_RSI);
      if (sVar2 != 1) {
        errsigf(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
      }
      iVar1 = osrp2(&stack0xffffffffffffffcc);
      if (iVar1 == 0) break;
      in_stack_ffffffffffffffc0 = in_RDX;
      iVar1 = osrp2(&stack0xffffffffffffffcc);
      in_stack_ffffffffffffffb8 = (char *)((long)iVar1 + 0x20);
      osrp2(&stack0xffffffffffffffce);
      in_stack_ffffffffffffffd0 =
           (errcxdef *)
           mchalo(in_stack_ffffffffffffffd0,
                  CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                  (char *)in_stack_ffffffffffffffc0);
      iVar1 = osrp2(&stack0xffffffffffffffce);
      *(int *)((long)&in_stack_ffffffffffffffd0->errcxlgc + 4) = iVar1;
      in_stack_ffffffffffffffd0->errcxlog =
           (_func_void_void_ptr_char_ptr_int_int_erradef_ptr *)
           (in_stack_ffffffffffffffd0->errcxbuf +
           (long)*(int *)((long)&in_stack_ffffffffffffffd0->errcxlgc + 4) + -4);
      iVar1 = osrp2(&stack0xffffffffffffffcc);
      *(int *)&in_stack_ffffffffffffffd0->errcxlgc = iVar1;
      sVar2 = fread(in_stack_ffffffffffffffd0->errcxlog,
                    (long)*(int *)&in_stack_ffffffffffffffd0->errcxlgc,1,in_RSI);
      if ((sVar2 != 1) ||
         ((*(int *)((long)&in_stack_ffffffffffffffd0->errcxlgc + 4) != 0 &&
          (sVar2 = fread(&in_stack_ffffffffffffffd0->errcxofs,
                         (long)*(int *)((long)&in_stack_ffffffffffffffd0->errcxlgc + 4),1,in_RSI),
          sVar2 != 1)))) {
        errsigf(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,0);
      }
      ptVar3 = tok_find_define(ctx_00,(char *)in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
      if (ptVar3 == (tokdfdef *)0x0) {
        in_stack_ffffffffffffffd0->errcxptr = (errdef *)ctx_00->tokcxerr;
        ctx_00->tokcxerr = in_stack_ffffffffffffffd0;
      }
      else {
        free(in_stack_ffffffffffffffd0);
      }
    }
    ctx_00 = (tokcxdef *)&ctx_00->tokcxmem;
    local_1c = local_1c + -1;
  } while( true );
}

Assistant:

void tok_read_defines(tokcxdef *ctx, osfildef *fp, errcxdef *ec)
{
    int        i;
    tokdfdef **dfp;
    tokdfdef  *df;
    char       buf[4];

    /* write each element of the hash chains */
    for (i = TOKDFHSHSIZ, dfp = ctx->tokcxdf ; i ; ++dfp, --i)
    {
        /* read this hash chain */
        for (;;)
        {
            /* read the next entry's header, and stop if this is the end */
            if (osfrb(fp, buf, 4)) errsig(ec, ERR_RDGAM);
            if (osrp2(buf) == 0) break;

            /* set up a new symbol of the appropriate size */
            df = (tokdfdef *)mchalo(ec,
                                    (sizeof(tokdfdef) + osrp2(buf)
                                     + osrp2(buf+2) - 1),
                                    "tok_read_defines");
            df->explen = osrp2(buf+2);
            df->nm = df->expan + df->explen;
            df->len = osrp2(buf);

            /* read the rest of the symbol */
            if (osfrb(fp, df->nm, df->len)
                || (df->explen != 0 && osfrb(fp, df->expan, df->explen)))
                errsig(ec, ERR_RDGAM);

            /*
             *   If a symbol with this name already exists in the table,
             *   discard the new one -- the symbols defined by -D and the
             *   current set of built-in symbols takes precedence over the
             *   set loaded from the file.  
             */
            if (tok_find_define(ctx, df->nm, df->len))
            {
                /* simply discard this symbol */
                mchfre(df);
            }
            else
            {
                /* link it into this hash chain */
                df->nxt = *dfp;
                *dfp = df;
            }
        }
    }
}